

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O1

_Bool askfor_aux(char *buf,size_t len,
                _func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *keypress_h)

{
  wchar_t x_00;
  _Bool _Var1;
  _Bool _Var2;
  size_t sVar3;
  code *pcVar4;
  keypress kVar5;
  keypress kVar6;
  wchar_t x;
  wchar_t y;
  size_t nul;
  size_t k;
  wchar_t local_48;
  wchar_t local_44;
  size_t local_40;
  size_t local_38;
  
  local_38 = 0;
  local_40 = 0;
  pcVar4 = askfor_aux_keypress;
  if (keypress_h != (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0) {
    pcVar4 = keypress_h;
  }
  Term_locate(&local_48,&local_44);
  if (0x4f < (uint)local_48) {
    local_48 = L'\0';
  }
  x_00 = local_48;
  sVar3 = 0x50 - (long)local_48;
  if ((long)local_48 + len < 0x51) {
    sVar3 = len;
  }
  buf[sVar3 - 1] = '\0';
  local_40 = strlen(buf);
  Term_erase(x_00,local_44,(wchar_t)sVar3);
  Term_putstr(local_48,local_44,L'\xffffffff',L'\v',buf);
  _Var2 = true;
  do {
    Term_gotoxy(local_48 + (int)local_38,local_44);
    kVar5 = inkey();
    kVar6._8_4_ = kVar5._8_4_ & 0xff;
    kVar6.type = (int)kVar5._0_8_;
    kVar6.code = (int)((ulong)kVar5._0_8_ >> 0x20);
    _Var1 = (*pcVar4)(buf,sVar3,&local_38,&local_40,kVar6,_Var2);
    Term_erase(local_48,local_44,(wchar_t)sVar3);
    Term_putstr(local_48,local_44,L'\xffffffff',L'\x01',buf);
    _Var2 = false;
  } while (!_Var1);
  return kVar5.code != 0xe000;
}

Assistant:

bool askfor_aux(char *buf, size_t len, bool (*keypress_h)(char *, size_t, size_t *, size_t *, struct keypress, bool))
{
	int y, x;

	size_t k = 0;		/* Cursor position */
	size_t nul = 0;		/* Position of the null byte in the string */

	struct keypress ch = KEYPRESS_NULL;

	bool done = false;
	bool firsttime = true;

	if (keypress_h == NULL)
		keypress_h = askfor_aux_keypress;

	/* Locate the cursor */
	Term_locate(&x, &y);

	/* Paranoia */
	if ((x < 0) || (x >= 80)) x = 0;

	/* Restrict the length */
	if (x + len > 80) len = 80 - x;

	/* Truncate the default entry */
	buf[len-1] = '\0';

	/* Get the position of the null byte */
	nul = strlen(buf);

	/* Display the default answer */
	Term_erase(x, y, (int)len);
	Term_putstr(x, y, -1, COLOUR_YELLOW, buf);

	/* Process input */
	while (!done) {
		/* Place cursor */
		Term_gotoxy(x + k, y);

		/* Get a key */
		ch = inkey();

		/* Let the keypress handler deal with the keypress */
		done = keypress_h(buf, len, &k, &nul, ch, firsttime);

		/* Update the entry */
		Term_erase(x, y, (int)len);
		Term_putstr(x, y, -1, COLOUR_WHITE, buf);

		/* Not the first time round anymore */
		firsttime = false;
	}

	/* Done */
	return (ch.code != ESCAPE);
}